

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BHeap.h
# Opt level: O2

void __thiscall
ADS::BHeap<ADS::NodeDistancePairClass_*,_ADS::NDPObjPointerComparator>::swap
          (BHeap<ADS::NodeDistancePairClass_*,_ADS::NDPObjPointerComparator> *this,
          BNode<ADS::NodeDistancePairClass_*> *pNode1,
          BNode<ADS::NodeDistancePairClass_*> *pNode1Prev,
          BNode<ADS::NodeDistancePairClass_*> *pNode2,
          BNode<ADS::NodeDistancePairClass_*> *pNode2Prev)

{
  uint uVar1;
  BNode<ADS::NodeDistancePairClass_*> *pBVar2;
  Node<ADS::NodeDistancePairClass_*> **ppNVar3;
  Node<ADS::NodeDistancePairClass_*> **ppNVar4;
  BNode<ADS::NodeDistancePairClass_*> *pBVar5;
  BNode<ADS::NodeDistancePairClass_*> *pBVar6;
  double in_XMM0_Qa;
  
  pBVar5 = pNode2;
  pBVar6 = pNode1;
  if ((pNode1->pParent != pNode2) && (pBVar5 = pNode1, pBVar6 = pNode2, pNode2->pParent != pNode1))
  {
    log(in_XMM0_Qa);
    exit(1);
  }
  updateParent(this,pBVar6->pFirstChild,pBVar5);
  updateParent(this,(BNode<ADS::NodeDistancePairClass_*> *)
                    (pBVar6->super_Node<ADS::NodeDistancePairClass_*>).pRightSibling,pBVar6);
  pBVar6->pParent = pBVar5->pParent;
  pBVar5->pParent = pBVar6;
  pBVar5->pFirstChild = pBVar6->pFirstChild;
  pBVar6->pFirstChild = pBVar5;
  pBVar2 = pBVar6->pParent;
  if ((pBVar2 != (BNode<ADS::NodeDistancePairClass_*> *)0x0) && (pBVar2->pFirstChild == pBVar5)) {
    pBVar2->pFirstChild = pBVar6;
  }
  uVar1 = pNode1->uiDegree;
  pNode1->uiDegree = pNode2->uiDegree;
  pNode2->uiDegree = uVar1;
  ppNVar3 = &(pNode1->super_Node<ADS::NodeDistancePairClass_*>).pRightSibling;
  pBVar5 = (BNode<ADS::NodeDistancePairClass_*> *)
           (pNode1->super_Node<ADS::NodeDistancePairClass_*>).pRightSibling;
  pBVar6 = (BNode<ADS::NodeDistancePairClass_*> *)
           (pNode2->super_Node<ADS::NodeDistancePairClass_*>).pRightSibling;
  if (pBVar6 != pNode2) {
    *ppNVar3 = (Node<ADS::NodeDistancePairClass_*> *)pBVar6;
    ppNVar3 = &(pNode2Prev->super_Node<ADS::NodeDistancePairClass_*>).pRightSibling;
  }
  ppNVar4 = &(pNode2->super_Node<ADS::NodeDistancePairClass_*>).pRightSibling;
  *ppNVar3 = &pNode1->super_Node<ADS::NodeDistancePairClass_*>;
  if (pBVar5 != pNode1) {
    *ppNVar4 = (Node<ADS::NodeDistancePairClass_*> *)pBVar5;
    ppNVar4 = &(pNode1Prev->super_Node<ADS::NodeDistancePairClass_*>).pRightSibling;
  }
  *ppNVar4 = &pNode2->super_Node<ADS::NodeDistancePairClass_*>;
  return;
}

Assistant:

void BHeap<T, Comparator>::swap (BNode<T> *pNode1, BNode<T> *pNode1Prev,
                                     BNode<T> *pNode2, BNode<T> *pNode2Prev)
    {
        if ((pNode1->pParent != pNode2) && (pNode2->pParent != pNode1)) {
            log ("Error! Only parent/child nodes can be swapped\n");
            exit (1);
        }

        /* Update parent/child links */
        BNode<T> *pParent, *pChild;
        if (pNode1->pParent == pNode2) {
            pParent = pNode2;
            pChild = pNode1;
        }
        else {
            pParent = pNode1;
            pChild = pNode2;
        }

        updateParent (pChild->pFirstChild, pParent);
        updateParent (static_cast<BNode<T>*>(pChild->pRightSibling), pChild);

        pChild->pParent = pParent->pParent;
        pParent->pParent = pChild;
        pParent->pFirstChild = pChild->pFirstChild;
        pChild->pFirstChild = pParent;

        /* update new pChild's parent link to it*/
        if (pChild->pParent != NULL && pChild->pParent->pFirstChild == pParent)
            /* if pChild->pParent->pFirstChild points to one of previous
               pParent's siblings there is not need to update it, otherwise
               make it point to pChild */
            pChild->pParent->pFirstChild = pChild;
        
        unsigned int uiTmpDegree = pNode1->uiDegree;
        pNode1->uiDegree = pNode2->uiDegree;
        pNode2->uiDegree = uiTmpDegree;

       /* T elementTmp = pNode1->el;
        pNode1->el = pNode2->el;
        pNode2->el = elementTmp;*/

        /* Update sibling links */
        BNode<T> *pTmp = pNode1->getSibling();
        if (pNode2->getSibling() == pNode2) {
            pNode1->setSibling (pNode1);                
        }
        else {
            pNode1->setSibling (pNode2->getSibling());            
            pNode2Prev->pRightSibling = pNode1;
        }
        
        if (pTmp == pNode1) {
            pNode2->setSibling (pNode2);
        }
        else {
            pNode2->setSibling (pTmp);
            pNode1Prev->pRightSibling = pNode2;
        }
    }